

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void flip_16_masked_pixels
               (tgestate_t *state,uint8_t *pD,uint8_t *pE,uint8_t *pDdash,uint8_t *pEdash)

{
  uint8_t uVar1;
  
  uVar1 = state->reversed[*pE];
  *pE = state->reversed[*pD];
  *pD = uVar1;
  uVar1 = state->reversed[*pEdash];
  *pEdash = state->reversed[*pDdash];
  *pDdash = uVar1;
  return;
}

Assistant:

void flip_16_masked_pixels(tgestate_t *state,
                           uint8_t    *pD,
                           uint8_t    *pE,
                           uint8_t    *pDdash,
                           uint8_t    *pEdash)
{
  const uint8_t *HL;
  uint8_t        D, E;

  assert(state  != NULL);
  assert(pD     != NULL);
  assert(pE     != NULL);
  assert(pDdash != NULL);
  assert(pEdash != NULL);

  HL = &state->reversed[0];

  D = HL[*pE];
  E = HL[*pD];

  *pE = E;
  *pD = D;

  D = HL[*pEdash];
  E = HL[*pDdash];

  *pEdash = E;
  *pDdash = D;
}